

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::updateClusters(btSoftBody *this)

{
  btTransform *this_00;
  btVector3 *v2;
  uint uVar1;
  Cluster *cluster;
  Node *pNVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  btDbvtNode *pbVar6;
  long lVar7;
  int j;
  int i;
  long lVar8;
  int j_1;
  btVector3 *pbVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  btVector3 bVar13;
  CProfileSample __profile;
  btMatrix3x3 local_198;
  btVector3 a;
  btScalar local_158 [2];
  btScalar abStack_150 [2];
  btScalar local_148 [2];
  btScalar abStack_140 [14];
  btVector3 mi;
  btVector3 mx;
  btVector3 local_a0;
  btMatrix3x3 r;
  btMatrix3x3 s;
  
  CProfileManager::Start_Profile("UpdateClusters");
  for (lVar7 = 0; lVar7 < (this->m_clusters).m_size; lVar7 = lVar7 + 1) {
    cluster = (this->m_clusters).m_data[lVar7];
    uVar1 = (cluster->m_nodes).m_size;
    if ((long)(int)uVar1 != 0) {
      local_198.m_el[2].m_floats[1] = 0.0;
      local_198.m_el[1].m_floats[2] = 0.0;
      local_198.m_el[1].m_floats[3] = 0.0;
      local_198.m_el[2].m_floats[0] = 0.0;
      local_198.m_el[0].m_floats[1] = 0.0;
      local_198.m_el[0].m_floats[2] = 0.0;
      local_198.m_el[0].m_floats[3] = 0.0;
      local_198.m_el[1].m_floats[0] = 0.0;
      local_198.m_el[0].m_floats[0] = 0.0001;
      local_198.m_el[1].m_floats[1] = 0.0002;
      local_198.m_el[2].m_floats[2] = 0.00029999999;
      local_198.m_el[2].m_floats[3] = 0.0;
      bVar13 = clusterCom(cluster);
      v2 = &cluster->m_com;
      *&(cluster->m_com).m_floats = bVar13.m_floats;
      lVar11 = 0;
      for (lVar8 = 0; lVar8 < (cluster->m_nodes).m_size; lVar8 = lVar8 + 1) {
        a = operator-(&(cluster->m_nodes).m_data[lVar8]->m_x,v2);
        pbVar9 = (btVector3 *)((long)((cluster->m_framerefs).m_data)->m_floats + lVar11);
        bVar13 = operator*(pbVar9,a.m_floats);
        local_198.m_el[0].m_floats[0] = bVar13.m_floats[0] + local_198.m_el[0].m_floats[0];
        local_198.m_el[0].m_floats[1] = bVar13.m_floats[1] + local_198.m_el[0].m_floats[1];
        local_198.m_el[0].m_floats[2] = bVar13.m_floats[2] + local_198.m_el[0].m_floats[2];
        bVar13 = operator*(pbVar9,a.m_floats + 1);
        local_198.m_el[1].m_floats[0] = bVar13.m_floats[0] + local_198.m_el[1].m_floats[0];
        local_198.m_el[1].m_floats[1] = bVar13.m_floats[1] + local_198.m_el[1].m_floats[1];
        local_198.m_el[1].m_floats[2] = bVar13.m_floats[2] + local_198.m_el[1].m_floats[2];
        bVar13 = operator*(pbVar9,a.m_floats + 2);
        local_198.m_el[2].m_floats[0] = bVar13.m_floats[0] + local_198.m_el[2].m_floats[0];
        local_198.m_el[2].m_floats[1] = bVar13.m_floats[1] + local_198.m_el[2].m_floats[1];
        local_198.m_el[2].m_floats[2] = bVar13.m_floats[2] + local_198.m_el[2].m_floats[2];
        lVar11 = lVar11 + 0x10;
      }
      PolarDecompose(&local_198,&r,&s);
      this_00 = &cluster->m_framexform;
      uVar5 = *(undefined8 *)((cluster->m_com).m_floats + 2);
      *(undefined8 *)(cluster->m_framexform).m_origin.m_floats = *(undefined8 *)v2->m_floats;
      *(undefined8 *)((cluster->m_framexform).m_origin.m_floats + 2) = uVar5;
      *(undefined8 *)(cluster->m_framexform).m_basis.m_el[0].m_floats = r.m_el[0].m_floats._0_8_;
      *(undefined8 *)((cluster->m_framexform).m_basis.m_el[0].m_floats + 2) =
           r.m_el[0].m_floats._8_8_;
      *(undefined8 *)(cluster->m_framexform).m_basis.m_el[1].m_floats = r.m_el[1].m_floats._0_8_;
      *(undefined8 *)((cluster->m_framexform).m_basis.m_el[1].m_floats + 2) =
           r.m_el[1].m_floats._8_8_;
      *(undefined8 *)(cluster->m_framexform).m_basis.m_el[2].m_floats = r.m_el[2].m_floats._0_8_;
      *(undefined8 *)((cluster->m_framexform).m_basis.m_el[2].m_floats + 2) =
           r.m_el[2].m_floats._8_8_;
      operator*((btMatrix3x3 *)&mi,&this_00->m_basis,&cluster->m_locii);
      btMatrix3x3::transpose((btMatrix3x3 *)&mx,&this_00->m_basis);
      operator*((btMatrix3x3 *)&a,(btMatrix3x3 *)&mi,(btMatrix3x3 *)&mx);
      *(undefined8 *)(cluster->m_invwi).m_el[0].m_floats = a.m_floats._0_8_;
      *(undefined8 *)((cluster->m_invwi).m_el[0].m_floats + 2) = a.m_floats._8_8_;
      *(btScalar (*) [2])(cluster->m_invwi).m_el[1].m_floats = local_158;
      *(btScalar (*) [2])((cluster->m_invwi).m_el[1].m_floats + 2) = abStack_150;
      *(btScalar (*) [2])(cluster->m_invwi).m_el[2].m_floats = local_148;
      *(undefined8 *)((cluster->m_invwi).m_el[2].m_floats + 2) = abStack_140._0_8_;
      pbVar9 = &cluster->m_lv;
      uVar10 = 0;
      if (0 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      (cluster->m_av).m_floats[0] = 0.0;
      (cluster->m_av).m_floats[1] = 0.0;
      (cluster->m_av).m_floats[2] = 0.0;
      (cluster->m_av).m_floats[3] = 0.0;
      (cluster->m_lv).m_floats[0] = 0.0;
      (cluster->m_lv).m_floats[1] = 0.0;
      (cluster->m_lv).m_floats[2] = 0.0;
      (cluster->m_lv).m_floats[3] = 0.0;
      for (lVar8 = 0; uVar10 * 4 != lVar8; lVar8 = lVar8 + 4) {
        a = operator*((btVector3 *)(*(long *)((long)(cluster->m_nodes).m_data + lVar8 * 2) + 0x30),
                      (btScalar *)((long)(cluster->m_masses).m_data + lVar8));
        btVector3::operator+=(pbVar9,&a);
        mx = operator-((btVector3 *)(*(long *)((long)(cluster->m_nodes).m_data + lVar8 * 2) + 0x10),
                       v2);
        mi = btVector3::cross(&mx,&a);
        btVector3::operator+=(&cluster->m_av,&mi);
      }
      bVar13 = operator*(pbVar9,&cluster->m_imass);
      fVar12 = 1.0 - cluster->m_ldamping;
      auVar3._4_4_ = bVar13.m_floats[1] * fVar12;
      auVar3._0_4_ = bVar13.m_floats[0] * fVar12;
      auVar3._8_4_ = fVar12 * bVar13.m_floats[2];
      auVar3._12_4_ = 0;
      *(undefined1 (*) [16])(cluster->m_lv).m_floats = auVar3;
      bVar13 = operator*(&cluster->m_invwi,&cluster->m_av);
      fVar12 = 1.0 - cluster->m_adamping;
      auVar4._4_4_ = bVar13.m_floats[1] * fVar12;
      auVar4._0_4_ = bVar13.m_floats[0] * fVar12;
      auVar4._8_4_ = fVar12 * bVar13.m_floats[2];
      auVar4._12_4_ = 0;
      *(undefined1 (*) [16])(cluster->m_av).m_floats = auVar4;
      cluster->m_vimpulses[0].m_floats[0] = 0.0;
      cluster->m_vimpulses[0].m_floats[1] = 0.0;
      cluster->m_vimpulses[0].m_floats[2] = 0.0;
      cluster->m_vimpulses[0].m_floats[3] = 0.0;
      cluster->m_vimpulses[1].m_floats[0] = 0.0;
      cluster->m_vimpulses[1].m_floats[1] = 0.0;
      cluster->m_vimpulses[1].m_floats[2] = 0.0;
      cluster->m_vimpulses[1].m_floats[3] = 0.0;
      cluster->m_dimpulses[0].m_floats[0] = 0.0;
      cluster->m_dimpulses[0].m_floats[1] = 0.0;
      cluster->m_dimpulses[0].m_floats[2] = 0.0;
      cluster->m_dimpulses[0].m_floats[3] = 0.0;
      cluster->m_nvimpulses = 0;
      cluster->m_ndimpulses = 0;
      cluster->m_dimpulses[1].m_floats[0] = 0.0;
      cluster->m_dimpulses[1].m_floats[1] = 0.0;
      cluster->m_dimpulses[1].m_floats[2] = 0.0;
      cluster->m_dimpulses[1].m_floats[3] = 0.0;
      if (0.0 < cluster->m_matching) {
        lVar11 = 0;
        for (lVar8 = 0; lVar8 < (cluster->m_nodes).m_size; lVar8 = lVar8 + 1) {
          pNVar2 = (cluster->m_nodes).m_data[lVar8];
          a = btTransform::operator()
                        (this_00,(btVector3 *)
                                 ((long)((cluster->m_framerefs).m_data)->m_floats + lVar11));
          bVar13 = Lerp<btVector3>(&pNVar2->m_x,&a,cluster->m_matching);
          *&(pNVar2->m_x).m_floats = bVar13.m_floats;
          lVar11 = lVar11 + 0x10;
        }
      }
      if (cluster->m_collide == true) {
        pNVar2 = *(cluster->m_nodes).m_data;
        mi.m_floats = *&(pNVar2->m_x).m_floats;
        mx.m_floats = *&(pNVar2->m_x).m_floats;
        for (lVar8 = 1; bVar13.m_floats = mx.m_floats, lVar8 < (int)uVar1; lVar8 = lVar8 + 1) {
          btVector3::setMin(&mi,&(cluster->m_nodes).m_data[lVar8]->m_x);
          btVector3::setMax(&mx,&(cluster->m_nodes).m_data[lVar8]->m_x);
        }
        a = mi;
        local_158[0] = mx.m_floats[0];
        local_158[1] = mx.m_floats[1];
        abStack_150[0] = mx.m_floats[2];
        abStack_150[1] = mx.m_floats[3];
        pbVar6 = cluster->m_leaf;
        mx.m_floats = bVar13.m_floats;
        if (pbVar6 == (btDbvtNode *)0x0) {
          pbVar6 = btDbvt::insert(&this->m_cdbvt,(btDbvtVolume *)&a,cluster);
          cluster->m_leaf = pbVar6;
        }
        else {
          bVar13 = operator*(pbVar9,&(this->m_sst).sdt);
          local_a0.m_floats[1] = bVar13.m_floats[1] * 3.0;
          local_a0.m_floats[0] = bVar13.m_floats[0] * 3.0;
          local_a0.m_floats[2] = bVar13.m_floats[2] * 3.0;
          local_a0.m_floats[3] = 0.0;
          btDbvt::update(&this->m_cdbvt,pbVar6,(btDbvtVolume *)&a,&local_a0,(this->m_sst).radmrg);
        }
      }
    }
  }
  CProfileSample::~CProfileSample(&__profile);
  return;
}

Assistant:

void					btSoftBody::updateClusters()
{
	BT_PROFILE("UpdateClusters");
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		btSoftBody::Cluster&	c=*m_clusters[i];
		const int				n=c.m_nodes.size();
		//const btScalar			invn=1/(btScalar)n;
		if(n)
		{
			/* Frame				*/ 
			const btScalar	eps=btScalar(0.0001);
			btMatrix3x3		m,r,s;
			m[0]=m[1]=m[2]=btVector3(0,0,0);
			m[0][0]=eps*1;
			m[1][1]=eps*2;
			m[2][2]=eps*3;
			c.m_com=clusterCom(&c);
			for(int i=0;i<c.m_nodes.size();++i)
			{
				const btVector3		a=c.m_nodes[i]->m_x-c.m_com;
				const btVector3&	b=c.m_framerefs[i];
				m[0]+=a[0]*b;m[1]+=a[1]*b;m[2]+=a[2]*b;
			}
			PolarDecompose(m,r,s);
			c.m_framexform.setOrigin(c.m_com);
			c.m_framexform.setBasis(r);		
			/* Inertia			*/ 
#if 1/* Constant	*/ 
			c.m_invwi=c.m_framexform.getBasis()*c.m_locii*c.m_framexform.getBasis().transpose();
#else
#if 0/* Sphere	*/ 
			const btScalar	rk=(2*c.m_extents.length2())/(5*c.m_imass);
			const btVector3	inertia(rk,rk,rk);
			const btVector3	iin(btFabs(inertia[0])>SIMD_EPSILON?1/inertia[0]:0,
				btFabs(inertia[1])>SIMD_EPSILON?1/inertia[1]:0,
				btFabs(inertia[2])>SIMD_EPSILON?1/inertia[2]:0);

			c.m_invwi=c.m_xform.getBasis().scaled(iin)*c.m_xform.getBasis().transpose();
#else/* Actual	*/ 		
			c.m_invwi[0]=c.m_invwi[1]=c.m_invwi[2]=btVector3(0,0,0);
			for(int i=0;i<n;++i)
			{
				const btVector3	k=c.m_nodes[i]->m_x-c.m_com;
				const btVector3		q=k*k;
				const btScalar		m=1/c.m_nodes[i]->m_im;
				c.m_invwi[0][0]	+=	m*(q[1]+q[2]);
				c.m_invwi[1][1]	+=	m*(q[0]+q[2]);
				c.m_invwi[2][2]	+=	m*(q[0]+q[1]);
				c.m_invwi[0][1]	-=	m*k[0]*k[1];
				c.m_invwi[0][2]	-=	m*k[0]*k[2];
				c.m_invwi[1][2]	-=	m*k[1]*k[2];
			}
			c.m_invwi[1][0]=c.m_invwi[0][1];
			c.m_invwi[2][0]=c.m_invwi[0][2];
			c.m_invwi[2][1]=c.m_invwi[1][2];
			c.m_invwi=c.m_invwi.inverse();
#endif
#endif
			/* Velocities			*/ 
			c.m_lv=btVector3(0,0,0);
			c.m_av=btVector3(0,0,0);
			{
				int i;

				for(i=0;i<n;++i)
				{
					const btVector3	v=c.m_nodes[i]->m_v*c.m_masses[i];
					c.m_lv	+=	v;
					c.m_av	+=	btCross(c.m_nodes[i]->m_x-c.m_com,v);
				}
			}
			c.m_lv=c.m_imass*c.m_lv*(1-c.m_ldamping);
			c.m_av=c.m_invwi*c.m_av*(1-c.m_adamping);
			c.m_vimpulses[0]	=
				c.m_vimpulses[1]	= btVector3(0,0,0);
			c.m_dimpulses[0]	=
				c.m_dimpulses[1]	= btVector3(0,0,0);
			c.m_nvimpulses		= 0;
			c.m_ndimpulses		= 0;
			/* Matching				*/ 
			if(c.m_matching>0)
			{
				for(int j=0;j<c.m_nodes.size();++j)
				{
					Node&			n=*c.m_nodes[j];
					const btVector3	x=c.m_framexform*c.m_framerefs[j];
					n.m_x=Lerp(n.m_x,x,c.m_matching);
				}
			}			
			/* Dbvt					*/ 
			if(c.m_collide)
			{
				btVector3	mi=c.m_nodes[0]->m_x;
				btVector3	mx=mi;
				for(int j=1;j<n;++j)
				{
					mi.setMin(c.m_nodes[j]->m_x);
					mx.setMax(c.m_nodes[j]->m_x);
				}			
				ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(mi,mx);
				if(c.m_leaf)
					m_cdbvt.update(c.m_leaf,bounds,c.m_lv*m_sst.sdt*3,m_sst.radmrg);
				else
					c.m_leaf=m_cdbvt.insert(bounds,&c);
			}
		}
	}


}